

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

wchar_t parse_line(archive_read *a,archive_entry *entry,mtree *mtree,mtree_entry *mp,
                  wchar_t *parsed_kws)

{
  char cVar1;
  char *__s1;
  int iVar2;
  wchar_t wVar3;
  char *pcVar4;
  size_t n;
  int64_t iVar5;
  ulong ns;
  wchar_t wVar6;
  uint type;
  byte *name;
  wchar_t wVar7;
  mtree_option *pmVar8;
  dev_t dev;
  byte *local_50;
  int64_t local_48;
  archive_string *local_40;
  mtree *local_38;
  
  pmVar8 = (mtree_option *)&mp->options;
  local_40 = &mtree->contents_name;
  local_38 = mtree;
  wVar7 = L'\0';
  do {
    pmVar8 = pmVar8->next;
    if (pmVar8 == (mtree_option *)0x0) {
      if ((wVar7 == L'\0') && (wVar7 = L'\0', (*parsed_kws & L'Ā') == L'\0')) {
        archive_set_error(&a->archive,0x54,"Missing type keyword in mtree specification");
        wVar7 = L'\xffffffec';
      }
      return wVar7;
    }
    __s1 = pmVar8->value;
    cVar1 = *__s1;
    wVar3 = L'\0';
    wVar6 = L'\0';
    if (cVar1 == '\0') goto LAB_00147e7e;
    iVar2 = strcmp(__s1,"nochange");
    if (iVar2 == 0) {
      *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 0x10;
      wVar3 = wVar6;
      goto LAB_00147e7e;
    }
    iVar2 = strcmp(__s1,"optional");
    if (iVar2 == 0) {
      *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 8;
      goto LAB_00147e7e;
    }
    iVar2 = strcmp(__s1,"ignore");
    if (iVar2 == 0) goto LAB_00147e7e;
    pcVar4 = strchr(__s1,0x3d);
    if (pcVar4 == (char *)0x0) {
      archive_set_error(&a->archive,0x54,"Malformed attribute \"%s\" (%d)",__s1,
                        (ulong)(uint)(int)cVar1);
LAB_00147e76:
      wVar3 = L'\xffffffec';
      goto LAB_00147e7e;
    }
    *pcVar4 = '\0';
    name = (byte *)(pcVar4 + 1);
    local_50 = name;
    switch(*__s1) {
    case 'c':
      iVar2 = strcmp(__s1,"content");
      if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"contents"), iVar2 == 0)) {
        parse_escapes((char *)name,(mtree_entry *)0x0);
        (local_38->contents_name).length = 0;
        n = strlen((char *)name);
        archive_strncat(local_40,name,n);
        wVar3 = L'\0';
      }
      else {
        iVar2 = strcmp(__s1,"cksum");
        if (iVar2 != 0) goto switchD_00147df2_caseD_65;
      }
      break;
    case 'd':
      iVar2 = strcmp(__s1,"device");
      if (iVar2 != 0) goto switchD_00147df2_caseD_65;
      *(byte *)parsed_kws = (byte)*parsed_kws | 1;
      wVar3 = parse_device(&dev,&a->archive,(char *)name);
      if (wVar3 == L'\0') {
        archive_entry_set_rdev(entry,dev);
      }
      break;
    default:
switchD_00147df2_caseD_65:
      archive_set_error(&a->archive,0x54,"Unrecognized key %s=%s",__s1,name);
      goto LAB_001482d0;
    case 'f':
      iVar2 = strcmp(__s1,"flags");
      if (iVar2 != 0) goto switchD_00147df2_caseD_65;
      *(byte *)parsed_kws = (byte)*parsed_kws | 2;
      archive_entry_copy_fflags_text(entry,(char *)name);
      wVar3 = wVar6;
      break;
    case 'g':
      iVar2 = strcmp(__s1,"gid");
      if (iVar2 == 0) {
        *(byte *)parsed_kws = (byte)*parsed_kws | 4;
        iVar5 = mtree_atol((char **)&local_50,L'\n');
        archive_entry_set_gid(entry,iVar5);
        wVar3 = wVar6;
      }
      else {
        iVar2 = strcmp(__s1,"gname");
        if (iVar2 != 0) goto switchD_00147df2_caseD_65;
        *(byte *)parsed_kws = (byte)*parsed_kws | 8;
        archive_entry_copy_gname(entry,(char *)name);
        wVar3 = wVar6;
      }
      break;
    case 'i':
      iVar2 = strcmp(__s1,"inode");
      if (iVar2 != 0) goto switchD_00147df2_caseD_65;
      iVar5 = mtree_atol((char **)&local_50,L'\n');
      archive_entry_set_ino(entry,iVar5);
      wVar3 = wVar6;
      break;
    case 'l':
      iVar2 = strcmp(__s1,"link");
      if (iVar2 != 0) goto switchD_00147df2_caseD_65;
      parse_escapes((char *)name,(mtree_entry *)0x0);
      archive_entry_copy_symlink(entry,(char *)name);
      wVar3 = L'\0';
      break;
    case 'm':
      iVar2 = strcmp(__s1,"md5");
      if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"md5digest"), iVar2 == 0)) {
        wVar3 = L'\x01';
        goto LAB_00148497;
      }
      iVar2 = strcmp(__s1,"mode");
      if (iVar2 != 0) goto switchD_00147df2_caseD_65;
      if (0xf7 < (byte)(*name - 0x38)) {
        *(byte *)parsed_kws = (byte)*parsed_kws | 0x40;
        iVar5 = mtree_atol((char **)&local_50,L'\b');
        archive_entry_set_perm(entry,(mode_t)iVar5);
        wVar3 = wVar6;
        break;
      }
      archive_set_error(&a->archive,0x54,"Symbolic or non-octal mode \"%s\" unsupported",name);
LAB_001482d0:
      wVar3 = L'\xffffffec';
      break;
    case 'n':
      iVar2 = strcmp(__s1,"nlink");
      if (iVar2 != 0) goto switchD_00147df2_caseD_65;
      *(byte *)parsed_kws = (byte)*parsed_kws | 0x20;
      iVar5 = mtree_atol((char **)&local_50,L'\n');
      archive_entry_set_nlink(entry,(uint)iVar5);
      wVar3 = wVar6;
      break;
    case 'r':
      iVar2 = strcmp(__s1,"resdevice");
      if (iVar2 == 0) {
        wVar3 = parse_device(&dev,&a->archive,(char *)name);
        if (wVar3 == L'\0') {
          archive_entry_set_dev(entry,dev);
        }
      }
      else {
        iVar2 = strcmp(__s1,"rmd160");
        if ((iVar2 != 0) && (iVar2 = strcmp(__s1,"rmd160digest"), iVar2 != 0))
        goto switchD_00147df2_caseD_65;
        wVar3 = parse_digest(a,entry,(char *)name,L'\x02');
      }
      break;
    case 's':
      iVar2 = strcmp(__s1,"sha1");
      if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"sha1digest"), iVar2 == 0)) {
        wVar3 = L'\x03';
      }
      else {
        iVar2 = strcmp(__s1,"sha256");
        if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"sha256digest"), iVar2 == 0)) {
          wVar3 = L'\x04';
        }
        else {
          iVar2 = strcmp(__s1,"sha384");
          if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"sha384digest"), iVar2 == 0)) {
            wVar3 = L'\x05';
          }
          else {
            iVar2 = strcmp(__s1,"sha512");
            if ((iVar2 != 0) && (iVar2 = strcmp(__s1,"sha512digest"), iVar2 != 0)) {
              iVar2 = strcmp(__s1,"size");
              if (iVar2 == 0) {
                iVar5 = mtree_atol((char **)&local_50,L'\n');
                archive_entry_set_size(entry,iVar5);
                wVar3 = wVar6;
                break;
              }
              goto switchD_00147df2_caseD_65;
            }
            wVar3 = L'\x06';
          }
        }
      }
LAB_00148497:
      wVar3 = parse_digest(a,entry,(char *)name,wVar3);
      break;
    case 't':
      iVar2 = strcmp(__s1,"tags");
      wVar3 = wVar6;
      if (iVar2 != 0) {
        iVar2 = strcmp(__s1,"time");
        if (iVar2 == 0) {
          *(byte *)parsed_kws = (byte)*parsed_kws | 0x10;
          iVar5 = mtree_atol((char **)&local_50,L'\n');
          if (*local_50 == 0x2e) {
            local_50 = local_50 + 1;
            local_48 = iVar5;
            ns = mtree_atol((char **)&local_50,L'\n');
            iVar5 = local_48;
            if ((long)ns < 0) {
              ns = 0;
            }
            else if (0x3b9ac9fe < ns) {
              ns = 999999999;
            }
          }
          else {
            ns = 0;
          }
          archive_entry_set_mtime(entry,iVar5,ns);
        }
        else {
          iVar2 = strcmp(__s1,"type");
          if (iVar2 != 0) goto switchD_00147df2_caseD_65;
          switch(*name) {
          case 0x62:
            iVar2 = strcmp((char *)name,"block");
            if (iVar2 != 0) goto switchD_00147eef_caseD_65;
            *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 1;
            type = 0x6000;
            break;
          case 99:
            iVar2 = strcmp((char *)name,"char");
            if (iVar2 != 0) goto switchD_00147eef_caseD_65;
            *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 1;
            type = 0x2000;
            break;
          case 100:
            iVar2 = strcmp((char *)name,"dir");
            if (iVar2 != 0) goto switchD_00147eef_caseD_65;
            *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 1;
            type = 0x4000;
            break;
          default:
switchD_00147eef_caseD_65:
            archive_set_error(&a->archive,0x54,"Unrecognized file type \"%s\"; assuming \"file\"",
                              name);
            archive_entry_set_filetype(entry,0x8000);
            goto LAB_00147e76;
          case 0x66:
            iVar2 = strcmp((char *)name,"fifo");
            if (iVar2 == 0) {
              *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 1;
              type = 0x1000;
            }
            else {
              iVar2 = strcmp((char *)name,"file");
              if (iVar2 != 0) goto switchD_00147eef_caseD_65;
              *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 1;
              type = 0x8000;
            }
            break;
          case 0x6c:
            iVar2 = strcmp((char *)name,"link");
            if (iVar2 != 0) goto switchD_00147eef_caseD_65;
            *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 1;
            type = 0xa000;
          }
          archive_entry_set_filetype(entry,type);
        }
      }
      break;
    case 'u':
      iVar2 = strcmp(__s1,"uid");
      if (iVar2 == 0) {
        *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 2;
        iVar5 = mtree_atol((char **)&local_50,L'\n');
        archive_entry_set_uid(entry,iVar5);
        wVar3 = wVar6;
      }
      else {
        iVar2 = strcmp(__s1,"uname");
        if (iVar2 != 0) goto switchD_00147df2_caseD_65;
        *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 4;
        archive_entry_copy_uname(entry,(char *)name);
        wVar3 = wVar6;
      }
    }
LAB_00147e7e:
    if (wVar3 < wVar7) {
      wVar7 = wVar3;
    }
  } while( true );
}

Assistant:

static int
parse_line(struct archive_read *a, struct archive_entry *entry,
    struct mtree *mtree, struct mtree_entry *mp, int *parsed_kws)
{
	struct mtree_option *iter;
	int r = ARCHIVE_OK, r1;

	for (iter = mp->options; iter != NULL; iter = iter->next) {
		r1 = parse_keyword(a, mtree, entry, iter, parsed_kws);
		if (r1 < r)
			r = r1;
	}
	if (r == ARCHIVE_OK && (*parsed_kws & MTREE_HAS_TYPE) == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Missing type keyword in mtree specification");
		return (ARCHIVE_WARN);
	}
	return (r);
}